

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latexOutline.cpp
# Opt level: O2

optional<OutlineCommandData> *
getArgumentToCommand
          (optional<OutlineCommandData> *__return_storage_ptr__,TSNode commandNode,File *file,
          bool hasStar)

{
  char16_t cVar1;
  TSNode self;
  TSNode self_00;
  TSNode self_01;
  TSNode self_02;
  TSNode node_00;
  TSNode self_03;
  TSNode self_04;
  TSNode self_05;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  TSPoint TVar5;
  Point PVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  uint uVar12;
  bool bVar13;
  TSNode node;
  u16string text_1;
  string text;
  undefined6 in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffebe;
  _Head_base<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_false>
  in_stack_fffffffffffffec8;
  pointer in_stack_fffffffffffffed0;
  TSTree *in_stack_fffffffffffffed8;
  TSTree *pTStack_120;
  u16string local_108;
  u16string local_e8;
  undefined1 local_c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_b0;
  _Alloc_hider _Stack_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  aStack_90;
  state_type sStack_80;
  size_t local_78;
  undefined8 uStack_70;
  OutlineCommandData local_60;
  
  self_04.context._8_8_ = in_stack_fffffffffffffec8._M_head_impl;
  self_04.context._0_8_ = __return_storage_ptr__;
  self_04.id = in_stack_fffffffffffffed0;
  self_04.tree = in_stack_fffffffffffffed8;
  ts_node_next_named_sibling(self_04);
  bVar13 = true;
  bVar11 = false;
  do {
    self.context._8_8_ = in_stack_fffffffffffffed0;
    self.context._0_8_ = in_stack_fffffffffffffec8._M_head_impl;
    self.id = in_stack_fffffffffffffed8;
    self.tree = pTStack_120;
    _Var2 = ts_node_is_null(self);
    if (_Var2) {
      (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>)._M_payload.
      super__Optional_payload<OutlineCommandData,_true,_false,_false>.
      super__Optional_payload_base<OutlineCommandData>._M_engaged = false;
      return __return_storage_ptr__;
    }
    self_00.context._8_8_ = in_stack_fffffffffffffed0;
    self_00.context._0_8_ = in_stack_fffffffffffffec8._M_head_impl;
    self_00.id = in_stack_fffffffffffffed8;
    self_00.tree = pTStack_120;
    pcVar4 = ts_node_type(self_00);
    iVar3 = strcmp(pcVar4,"group");
    if (iVar3 == 0) {
      node_00.context._8_8_ = in_stack_fffffffffffffed0;
      node_00.context._0_8_ = in_stack_fffffffffffffec8._M_head_impl;
      node_00.id = in_stack_fffffffffffffed8;
      node_00.tree = pTStack_120;
      getGroupText_abi_cxx11_(&local_60.name,node_00,file);
      std::__cxx11::string::string((string *)local_c8,(string *)&local_60);
      self_03.context._8_8_ = in_stack_fffffffffffffed8;
      self_03.context._0_8_ = in_stack_fffffffffffffed0;
      self_03.id = pTStack_120;
      self_03.tree._0_6_ = in_stack_fffffffffffffeb8;
      self_03.tree._6_2_ = in_stack_fffffffffffffebe;
      TVar5 = ts_node_end_point(self_03);
      aStack_b0._8_8_ = fromTSPoint(TVar5);
      _Stack_a0._M_p._0_1_ = bVar11;
      std::optional<OutlineCommandData>::optional<OutlineCommandData,_true>
                (__return_storage_ptr__,(OutlineCommandData *)local_c8);
      std::__cxx11::string::~string((string *)local_c8);
      std::__cxx11::string::~string((string *)&local_60);
      return __return_storage_ptr__;
    }
    self_01.context._8_8_ = in_stack_fffffffffffffed0;
    self_01.context._0_8_ = in_stack_fffffffffffffec8._M_head_impl;
    self_01.id = in_stack_fffffffffffffed8;
    self_01.tree = pTStack_120;
    pcVar4 = ts_node_type(self_01);
    iVar3 = strcmp(pcVar4,"text");
    if (iVar3 == 0) {
      self_02.context._8_8_ = in_stack_fffffffffffffed0;
      self_02.context._0_8_ = in_stack_fffffffffffffec8._M_head_impl;
      self_02.id = in_stack_fffffffffffffed8;
      self_02.tree = pTStack_120;
      TVar5 = ts_node_start_point(self_02);
      PVar6 = fromTSPoint(TVar5);
      uVar10 = (ulong)PVar6 >> 0x20;
      File::textForNode_abi_cxx11_(&local_108,file,(TSNode *)&stack0xfffffffffffffec8);
      uVar8 = 0;
      while (uVar7 = (uint)uVar8, uVar8 < local_108._M_string_length) {
        cVar1 = local_108._M_dataplus._M_p[uVar8];
        uVar9 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar9;
        if (cVar1 != L'\t') {
          uVar12 = PVar6.row;
          if (cVar1 == L'\n') {
            if (!bVar13) {
              (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
              _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
              super__Optional_payload_base<OutlineCommandData>._M_engaged = false;
              goto LAB_0017f3a4;
            }
LAB_0017f21f:
            PVar6.row = uVar12 + 1;
            PVar6.column = 0;
            uVar10 = 0;
            bVar13 = false;
          }
          else if (cVar1 != L' ') {
            if (cVar1 != L'*') {
              if (cVar1 != L'%') {
                local_78 = 0;
                uStack_70._0_1_ = false;
                uStack_70._1_1_ = false;
                uStack_70._2_6_ = 0;
                aStack_90._8_8_ = 0;
                sStack_80.__count = 0;
                sStack_80.__value = (anon_union_4_2_91654ee9_for___value)0x0;
                local_98 = 0;
                aStack_90._M_allocated_capacity = 0;
                aStack_b0._8_8_ = 0;
                _Stack_a0._M_p = (pointer)0x0;
                local_c8._16_8_ = (TSTree *)0x0;
                aStack_b0._M_allocated_capacity = 0;
                local_c8._0_8_ =
                     (__uniq_ptr_impl<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
                      )0x0;
                local_c8._8_8_ = (pointer)0x0;
                std::__cxx11::
                wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                ::wstring_convert((wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                                   *)local_c8);
                local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
                std::__cxx11::u16string::_M_construct<char16_t_const*>
                          ((u16string *)&local_e8,&stack0xfffffffffffffebe,&stack0xfffffffffffffec0)
                ;
                UtfHandler::utf16to8(&local_60.name,(UtfHandler *)local_c8,&local_e8);
                local_60.endPoint.row = uVar12;
                local_60.endPoint.column = uVar9;
                local_60.sawStar = bVar11;
                std::optional<OutlineCommandData>::optional<OutlineCommandData,_true>
                          (__return_storage_ptr__,&local_60);
                std::__cxx11::string::~string((string *)&local_60);
                std::__cxx11::u16string::~u16string((u16string *)&local_e8);
                std::__cxx11::
                wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                ::~wstring_convert((wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                                    *)local_c8);
LAB_0017f3a4:
                std::__cxx11::u16string::~u16string((u16string *)&local_108);
                return __return_storage_ptr__;
              }
              do {
                uVar7 = (uint)uVar8;
                if (local_108._M_string_length <= uVar8) break;
                uVar7 = uVar7 + 1;
                uVar8 = (ulong)uVar7;
              } while (local_108._M_dataplus._M_p[uVar8] != L'\n');
              goto LAB_0017f21f;
            }
            if ((hasStar & 1U) == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_c8,"*",(allocator<char> *)&local_60);
              aStack_b0._8_8_ = CONCAT44(uVar9,uVar12);
              _Stack_a0._M_p._0_1_ = bVar11;
              std::optional<OutlineCommandData>::optional<OutlineCommandData,_true>
                        (__return_storage_ptr__,(OutlineCommandData *)local_c8);
              std::__cxx11::string::~string((string *)local_c8);
              goto LAB_0017f3a4;
            }
            bVar11 = true;
            hasStar = false;
          }
        }
        uVar8 = (ulong)(uVar7 + 1);
      }
      std::__cxx11::u16string::~u16string((u16string *)&local_108);
    }
    self_05.context._8_8_ = in_stack_fffffffffffffec8._M_head_impl;
    self_05.context._0_8_ = __return_storage_ptr__;
    self_05.id = in_stack_fffffffffffffed0;
    self_05.tree = in_stack_fffffffffffffed8;
    ts_node_next_named_sibling(self_05);
    pTStack_120 = (TSTree *)aStack_b0._M_allocated_capacity;
    in_stack_fffffffffffffec8._M_head_impl =
         (codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0> *)local_c8._0_8_;
    in_stack_fffffffffffffed0 = (pointer)local_c8._8_8_;
    in_stack_fffffffffffffed8 = (TSTree *)local_c8._16_8_;
  } while( true );
}

Assistant:

std::optional<OutlineCommandData> getArgumentToCommand (TSNode commandNode, File &file, bool hasStar) {
    bool s_whitespace { true };
    bool sawStar { false };

    TSNode node = ts_node_next_named_sibling(commandNode);
    while (!ts_node_is_null(node)) {

        if (NODE_NAME_IS(node, "group")) {
            string text = getGroupText(node, file);

            return OutlineCommandData {
                text,
                fromTSPoint(ts_node_end_point(node)),
                sawStar
            };
        }

        if (NODE_NAME_IS(node, "text")) {
            Point point = fromTSPoint(ts_node_start_point(node));
            auto text = file.textForNode(node);
            auto len = text.size();

            for (unsigned int i = 0; i < len; i++) {
                auto c = text[i];
                point.column++; // points to column right of char

                if (c == ' ' || c == '\t') {
                    continue;
                } else if (c == '%') {
                    s_whitespace = false;
                    while (i < len) {
                        i++;
                        if (text[i] == '\n') { break; }
                    }
                    point.row++;
                    point.column = 0;
                } else if (c == '\n') {
                    if (!s_whitespace) {
                        return {};
                    }
                    point.row++;
                    point.column = 0;
                    s_whitespace = false;
                } else if (c == '*') {
                    if (hasStar) {
                        sawStar = true;
                        hasStar = false;
                    } else {
                        return OutlineCommandData{
                            "*",
                            point,
                            sawStar
                        };
                    }
                } else {
                    return OutlineCommandData {
                            UtfHandler().utf16to8(u16string { c }),
                            point,
                            sawStar
                    };
                }
            }
        }

        node = ts_node_next_named_sibling(node);
    }

    return {};
}